

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_4x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp1;
  INT32 tmp0;
  int local_4c;
  int *local_40;
  
  memset(in_RDI,0,0x100);
  local_40 = in_RDI;
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    pbVar10 = (byte *)(*(long *)(in_RSI + (long)local_4c * 8) + (ulong)in_EDX);
    bVar1 = *pbVar10;
    bVar2 = pbVar10[3];
    bVar3 = pbVar10[1];
    bVar4 = pbVar10[2];
    bVar5 = *pbVar10;
    bVar6 = pbVar10[3];
    bVar7 = pbVar10[1];
    bVar8 = pbVar10[2];
    *local_40 = ((uint)bVar1 + (uint)bVar2 + (uint)bVar3 + (uint)bVar4 + -0x200) * 0x20;
    local_40[2] = (((uint)bVar1 + (uint)bVar2) - ((uint)bVar3 + (uint)bVar4)) * 0x20;
    lVar11 = ((long)(int)((uint)bVar5 - (uint)bVar6) + (long)(int)((uint)bVar7 - (uint)bVar8)) *
             0x1151 + 0x80;
    local_40[1] = (int)((ulong)(lVar11 + (long)(int)((uint)bVar5 - (uint)bVar6) * 0x187e) >> 8);
    local_40[3] = (int)((ulong)(lVar11 + (long)(int)((uint)bVar7 - (uint)bVar8) * -0x3b21) >> 8);
    local_40 = local_40 + 8;
  }
  local_40 = in_RDI;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    iVar9 = *local_40;
    *local_40 = (int)((long)iVar9 + 2 + (long)local_40[8] >> 2);
    local_40[8] = (int)(((long)iVar9 + 2) - (long)local_40[8] >> 2);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)*(8/2) = 2**3, which we add here. */
  /* 4-point FDCT kernel, */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+3));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+3));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-4);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-3);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}